

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O2

ByteData *
cfd::core::WallyUtil::ConvertMnemonicToEntropy
          (ByteData *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *language,bool use_ideographic_space)

{
  words *w;
  CfdException *this;
  undefined7 in_register_00000009;
  allocator local_a5;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy_bytes;
  size_t out_size;
  undefined1 local_80 [32];
  string mnemonic_sentence;
  string delimitor;
  
  w = Bip39GetWordlist(language);
  ::std::__cxx11::string::string((string *)&delimitor," ",(allocator *)&mnemonic_sentence);
  if ((int)CONCAT71(in_register_00000009,use_ideographic_space) != 0) {
    ::std::__cxx11::string::assign((char *)&delimitor);
  }
  StringUtil::Join((string *)&mnemonic_sentence,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)mnemonic,(string *)&delimitor);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&entropy_bytes,0x40,(allocator_type *)local_80);
  out_size = 0;
  ret = bip39_mnemonic_to_bytes
                  (w,mnemonic_sentence._M_dataplus._M_p,
                   entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)entropy_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)entropy_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,&out_size);
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&entropy_bytes,out_size);
    ByteData::ByteData(__return_storage_ptr__,&entropy_bytes);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::__cxx11::string::~string((string *)&mnemonic_sentence);
    ::std::__cxx11::string::~string((string *)&delimitor);
    return __return_storage_ptr__;
  }
  local_80._0_8_ = "cfdcore_wally_util.cpp";
  local_80._8_4_ = 0x10e;
  local_80._16_8_ = "ConvertMnemonicToEntropy";
  logger::warn<int&>((CfdSourceLocation *)local_80,"Convert mnemonic to entropy error. ret=[{}]",
                     &ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_80,"Convert mnemonic to entropy error.",&local_a5);
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_80);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData WallyUtil::ConvertMnemonicToEntropy(
    const std::vector<std::string>& mnemonic, const std::string& language,
    bool use_ideographic_space) {
  words* wally_wordlist = Bip39GetWordlist(language);

  std::string delimitor = kMnemonicDelimiter;
  if (use_ideographic_space) {
    delimitor = kMnemonicIdeographicDelimiter;
  }
  std::string mnemonic_sentence = StringUtil::Join(mnemonic, delimitor);

  std::vector<uint8_t> entropy_bytes(kByteData512Length);
  size_t out_size = 0;
  int ret = bip39_mnemonic_to_bytes(
      wally_wordlist, mnemonic_sentence.c_str(), entropy_bytes.data(),
      entropy_bytes.size(), &out_size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Convert mnemonic to entropy error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Convert mnemonic to entropy error.");
  }

  entropy_bytes.resize(out_size);
  ByteData entropy(entropy_bytes);

  return entropy;
}